

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall
Json::BuiltStyledStreamWriter::isMultineArray(BuiltStyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  bool bVar5;
  long lVar6;
  int index;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  byte local_38;
  
  AVar2 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  iVar7 = 0;
  do {
    if (((int)AVar2 <= iVar7) || (bVar1)) {
      bVar5 = true;
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(long)(int)AVar2);
        this->field_0xd8 = this->field_0xd8 | 1;
        iVar7 = AVar2 * 2 + 2;
        uVar8 = 0;
        uVar9 = (ulong)AVar2;
        if ((int)AVar2 < 1) {
          uVar9 = uVar8;
        }
        lVar6 = 8;
        local_38 = 0;
        for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          pVVar4 = Value::operator[](value,(int)uVar8);
          bVar1 = hasCommentForValue(pVVar4);
          local_38 = local_38 | bVar1;
          pVVar4 = Value::operator[](value,(int)uVar8);
          writeValue(this,pVVar4);
          iVar7 = iVar7 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar6);
          lVar6 = lVar6 + 0x20;
        }
        this->field_0xd8 = this->field_0xd8 & 0xfe;
        bVar5 = (bool)(local_38 | this->rightMargin_ <= iVar7);
      }
      return bVar5;
    }
    pVVar4 = Value::operator[](value,iVar7);
    bVar1 = Value::isArray(pVVar4);
    if (bVar1) {
LAB_0012a607:
      AVar3 = Value::size(pVVar4);
      bVar1 = AVar3 != 0;
    }
    else {
      bVar1 = Value::isObject(pVVar4);
      if (bVar1) goto LAB_0012a607;
      bVar1 = false;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool BuiltStyledStreamWriter::isMultineArray(Value const& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}